

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_DCData.cpp
# Opt level: O0

h__Reader * __thiscall
ASDCP::DCData::MXFReader::h__Reader::ReadFrame
          (h__Reader *this,ui32_t FrameNum,FrameBuffer *FrameBuf,AESDecContext *Ctx,
          HMACContext *HMAC)

{
  ulong uVar1;
  AESDecContext *pAVar2;
  undefined4 in_register_00000034;
  long lVar3;
  HMACContext *HMAC_local;
  AESDecContext *Ctx_local;
  FrameBuffer *FrameBuf_local;
  ui32_t FrameNum_local;
  h__Reader *this_local;
  
  lVar3 = CONCAT44(in_register_00000034,FrameNum);
  uVar1 = (**(code **)(**(long **)(lVar3 + 0x10) + 0x40))();
  if ((uVar1 & 1) == 0) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_INIT);
  }
  else {
    if (*(long *)(lVar3 + 8) == 0) {
      __assert_fail("m_Dict",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_DCData.cpp"
                    ,0xc5,
                    "ASDCP::Result_t ASDCP::DCData::MXFReader::h__Reader::ReadFrame(ui32_t, FrameBuffer &, AESDecContext *, HMACContext *)"
                   );
    }
    if ((*(byte *)(lVar3 + 0x658) & 1) == 0) {
      pAVar2 = (AESDecContext *)Dictionary::ul(*(Dictionary **)(lVar3 + 8),MDD_DCDataEssence);
      h__ASDCPReader::ReadEKLVFrame
                (&this->super_h__ASDCPReader,FrameNum,(FrameBuffer *)((ulong)FrameBuf & 0xffffffff),
                 (byte_t *)Ctx,pAVar2,HMAC);
    }
    else {
      pAVar2 = (AESDecContext *)Dictionary::ul(*(Dictionary **)(lVar3 + 8),MDD_PrivateDCDataEssence)
      ;
      h__ASDCPReader::ReadEKLVFrame
                (&this->super_h__ASDCPReader,FrameNum,(FrameBuffer *)((ulong)FrameBuf & 0xffffffff),
                 (byte_t *)Ctx,pAVar2,HMAC);
    }
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::DCData::MXFReader::h__Reader::ReadFrame(ui32_t FrameNum, FrameBuffer& FrameBuf,
		      AESDecContext* Ctx, HMACContext* HMAC)
{
  if ( ! m_File->IsOpen() )
    return RESULT_INIT;

  assert(m_Dict);
  if ( m_PrivateLabelCompatibilityMode )
    {
      return ReadEKLVFrame(FrameNum, FrameBuf, m_Dict->ul(MDD_PrivateDCDataEssence), Ctx, HMAC);
    }

  return ReadEKLVFrame(FrameNum, FrameBuf, m_Dict->ul(MDD_DCDataEssence), Ctx, HMAC);
}